

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minihttp.cpp
# Opt level: O2

void __thiscall minihttp::HttpSocket::_DequeueMore(HttpSocket *this)

{
  bool bVar1;
  size_type sVar2;
  
  _FinishRequest(this);
  sVar2 = std::deque<minihttp::Request,_std::allocator<minihttp::Request>_>::size
                    (&(this->_requestQ).c);
  if (sVar2 != 0) {
    bVar1 = _EnqueueOrSend(this,(this->_requestQ).c.
                                super__Deque_base<minihttp::Request,_std::allocator<minihttp::Request>_>
                                ._M_impl.super__Deque_impl_data._M_start._M_cur,false);
    if (bVar1) {
      std::deque<minihttp::Request,_std::allocator<minihttp::Request>_>::pop_front
                (&(this->_requestQ).c);
      return;
    }
  }
  return;
}

Assistant:

void HttpSocket::_DequeueMore(void)
{
    traceprint("HttpSocket::_DequeueMore, Q = %u\n", (unsigned)_requestQ.size());
    _FinishRequest(); // In case this was not done yet.

    // _inProgress is known to be false here
    if(_requestQ.size()) // still have other requests queued?
        if(_EnqueueOrSend(_requestQ.front(), false)) // could we send?
            _requestQ.pop(); // if so, we are done with this request

    // otherwise, we are done for now. socket is kept alive for future sends. Nothing to do.
}